

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  Mutability MVar1;
  iterator this_00;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  pointer ppVar9;
  ulong uVar10;
  size_type sVar11;
  IString *this_01;
  mapped_type *pmVar12;
  mapped_type *this_02;
  value_type local_d8;
  key_type local_d4;
  value_type newIndex_1;
  Index i_2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  oldFieldNames;
  TypeNames *nameInfo;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_88;
  iterator iter;
  uint local_78;
  value_type newIndex;
  Index i_1;
  Index removed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexesAfterRemoval;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
  local_60;
  iterator remIter;
  uint local_44;
  Index i;
  vector<bool,_std::allocator<bool>_> *immutableVec;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
  local_30;
  iterator immIter;
  FieldList *newFields;
  Struct *struct__local;
  TypeRewriter *this_local;
  HeapType oldStructType_local;
  
  immIter.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
               )struct_;
  this_local = (TypeRewriter *)oldStructType.id;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
       ::find((unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
               *)(*(long *)((long)this + 0x68) + 0x68),(key_type *)&this_local);
  immutableVec = (vector<bool,_std::allocator<bool>_> *)
                 std::
                 unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::end((unordered_map<wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                        *)(*(long *)((long)this + 0x68) + 0x68));
  bVar2 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                      *)&immutableVec);
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>
                           *)&local_30);
    for (local_44 = 0; sVar5 = std::vector<bool,_std::allocator<bool>_>::size(&ppVar3->second),
        local_44 < sVar5; local_44 = local_44 + 1) {
      _remIter = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&ppVar3->second,(ulong)local_44);
      bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&remIter);
      if (bVar2) {
        pvVar7 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                            immIter.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur,(ulong)local_44);
        pvVar7->mutable_ = Immutable;
      }
    }
  }
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find((unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)(*(long *)((long)this + 0x68) + 0xa0),(key_type *)&this_local);
  indexesAfterRemoval =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end((unordered_map<wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)(*(long *)((long)this + 0x68) + 0xa0));
  bVar2 = std::__detail::operator!=
                    (&local_60,
                     (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                      *)&indexesAfterRemoval);
  if (bVar2) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_true>
                           *)&local_60);
    newIndex = 0;
    for (local_78 = 0;
        sVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                          ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                           immIter.
                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                           ._M_cur), this_00 = immIter, local_78 < sVar5; local_78 = local_78 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&ppVar4->second,(ulong)local_78);
      iter.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur.
      _4_4_ = *pvVar6;
      if (iter.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
          _M_cur._4_4_ == 0xffffffff) {
        newIndex = newIndex + 1;
      }
      else {
        pvVar7 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                            immIter.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur,(ulong)local_78);
        pvVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                            immIter.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur,(ulong)iter.
                                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                           ._M_cur._4_4_);
        (pvVar8->type).id = (pvVar7->type).id;
        MVar1 = pvVar7->mutable_;
        pvVar8->packedType = pvVar7->packedType;
        pvVar8->mutable_ = MVar1;
      }
    }
    sVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                       immIter.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                       ._M_cur);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::resize
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
               this_00.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
               ._M_cur,sVar5 - newIndex);
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
         ::find((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                 *)(*(long *)((long)this + 8) + 0x120),(key_type *)&this_local);
    nameInfo = (TypeNames *)
               std::
               unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
               ::end((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                      *)(*(long *)((long)this + 8) + 0x120));
    bVar2 = std::__detail::operator!=
                      (&local_88,
                       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        *)&nameInfo);
    if (bVar2) {
      ppVar9 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                           *)&local_88);
      oldFieldNames._M_h._M_single_bucket = (__node_base_ptr)&ppVar9->second;
      std::
      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
      ::unordered_map((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)&newIndex_1,&(ppVar9->second).fieldNames);
      std::
      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
      ::clear((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
               *)(oldFieldNames._M_h._M_single_bucket + 2));
      for (local_d4 = 0; uVar10 = (ulong)local_d4,
          sVar11 = std::
                   unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   ::size((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                           *)&newIndex_1), uVar10 < sVar11; local_d4 = local_d4 + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&ppVar4->second,(ulong)local_d4);
        local_d8 = *pvVar6;
        if ((local_d8 != 0xffffffff) &&
           (sVar11 = std::
                     unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     ::count((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                              *)&newIndex_1,&local_d4), sVar11 != 0)) {
          this_01 = &std::
                     unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                   *)&newIndex_1,&local_d4)->super_IString;
          bVar2 = IString::is(this_01);
          if (!bVar2) {
            __assert_fail("oldFieldNames[i].is()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                          ,0x133,
                          "virtual void wasm::(anonymous namespace)::GlobalTypeOptimization::updateTypes(Module &)::TypeRewriter::modifyStruct(HeapType, Struct &)"
                         );
          }
          pmVar12 = std::
                    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                  *)&newIndex_1,&local_d4);
          this_02 = std::
                    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                                  *)(oldFieldNames._M_h._M_single_bucket + 2),&local_d8);
          wasm::Name::operator=(this_02,pmVar12);
        }
      }
      std::
      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                        *)&newIndex_1);
    }
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        auto& newFields = struct_.fields;

        // Adjust immutability.
        auto immIter = parent.canBecomeImmutable.find(oldStructType);
        if (immIter != parent.canBecomeImmutable.end()) {
          auto& immutableVec = immIter->second;
          for (Index i = 0; i < immutableVec.size(); i++) {
            if (immutableVec[i]) {
              newFields[i].mutable_ = Immutable;
            }
          }
        }

        // Remove fields where we can.
        auto remIter = parent.indexesAfterRemovals.find(oldStructType);
        if (remIter != parent.indexesAfterRemovals.end()) {
          auto& indexesAfterRemoval = remIter->second;
          Index removed = 0;
          for (Index i = 0; i < newFields.size(); i++) {
            auto newIndex = indexesAfterRemoval[i];
            if (newIndex != RemovedField) {
              newFields[newIndex] = newFields[i];
            } else {
              removed++;
            }
          }
          newFields.resize(newFields.size() - removed);

          // Update field names as well. The Type Rewriter cannot do this for
          // us, as it does not know which old fields map to which new ones (it
          // just keeps the names in sequence).
          auto iter = wasm.typeNames.find(oldStructType);
          if (iter != wasm.typeNames.end()) {
            auto& nameInfo = iter->second;

            // Make a copy of the old ones to base ourselves off of as we do so.
            auto oldFieldNames = nameInfo.fieldNames;

            // Clear the old names and write the new ones.
            nameInfo.fieldNames.clear();
            for (Index i = 0; i < oldFieldNames.size(); i++) {
              auto newIndex = indexesAfterRemoval[i];
              if (newIndex != RemovedField && oldFieldNames.count(i)) {
                assert(oldFieldNames[i].is());
                nameInfo.fieldNames[newIndex] = oldFieldNames[i];
              }
            }
          }
        }
      }